

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O3

void boost::filesystem::detail::create_hard_link(path *to,path *from,error_code *ec)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = link((to->m_pathname)._M_dataplus._M_p,(from->m_pathname)._M_dataplus._M_p);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  anon_unknown.dwarf_59d9::error(iVar1,to,from,ec,"boost::filesystem::create_hard_link");
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void create_hard_link(const path& to, const path& from, error_code* ec)
  {

#   if defined(BOOST_WINDOWS_API) && _WIN32_WINNT < 0x0500  // SDK earlier than Win 2K

    error(BOOST_ERROR_NOT_SUPPORTED, to, from, ec,
      "boost::filesystem::create_hard_link");
#   else

#     if defined(BOOST_WINDOWS_API) && _WIN32_WINNT >= 0x0500
        // see if actually supported by Windows runtime dll
        if (error(!create_hard_link_api ? BOOST_ERROR_NOT_SUPPORTED : 0, to, from, ec,
            "boost::filesystem::create_hard_link"))
          return;
#     endif

    error(!BOOST_CREATE_HARD_LINK(from.c_str(), to.c_str()) ? BOOST_ERRNO : 0, to, from, ec,
      "boost::filesystem::create_hard_link");
#   endif
  }